

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O3

bool __thiscall ftxui::InputBase::OnEvent(InputBase *this,Event *event)

{
  pointer pcVar1;
  bool bVar2;
  string *this_00;
  string *psVar3;
  wstring local_98;
  undefined1 local_78 [24];
  _Alloc_hider local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  ScreenInteractive *local_40;
  
  psVar3 = (this->content_).address_;
  if (psVar3 == (string *)0x0) {
    psVar3 = &(this->content_).owned_;
  }
  to_wstring(&local_98,psVar3);
  std::__cxx11::wstring::operator=((wstring *)&this->wrapped_content_,(wstring *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity * 4 + 4);
  }
  local_78._0_4_ = event->type_;
  local_78._4_4_ = (event->field_1).mouse_.button;
  local_78._8_4_ = (event->field_1).mouse_.motion;
  local_78._12_4_ = *(undefined4 *)((long)&event->field_1 + 8);
  local_78._16_8_ = *(undefined8 *)((long)&event->field_1 + 0xc);
  pcVar1 = (event->input_)._M_dataplus._M_p;
  local_60._M_p = (pointer)&local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (event->input_)._M_string_length);
  local_40 = event->screen_;
  bVar2 = WideInputBase::OnEvent(&this->super_WideInputBase,(Event *)local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_p != &local_50) {
    operator_delete(local_60._M_p,local_50._M_allocated_capacity + 1);
  }
  if (bVar2) {
    to_string((string *)&local_98,&this->wrapped_content_);
    psVar3 = (this->content_).address_;
    this_00 = &(this->content_).owned_;
    if (psVar3 != (string *)0x0) {
      this_00 = psVar3;
    }
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar2;
}

Assistant:

bool OnEvent(Event event) override {
    wrapped_content_ = to_wstring(*content_);
    if (WideInputBase::OnEvent(event)) {
      *content_ = to_string(wrapped_content_);
      return true;
    }
    return false;
  }